

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.cpp
# Opt level: O3

ostream * spvtools::utils::operator<<(ostream *out,BitVector *bv)

{
  bool bVar1;
  ostream *poVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  char local_39;
  BitVector *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
  puVar3 = (bv->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (bv->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = bv;
  if (puVar4 != puVar3) {
    uVar6 = 0;
    do {
      uVar5 = puVar3[uVar6];
      if (uVar5 != 0) {
        do {
          if ((uVar5 & 1) != 0) {
            local_39 = ' ';
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_39,1);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          }
          bVar1 = 1 < uVar5;
          uVar5 = uVar5 >> 1;
        } while (bVar1);
        puVar3 = (local_38->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (local_38->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < (ulong)((long)puVar4 - (long)puVar3 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const BitVector& bv) {
  out << "{";
  for (uint32_t i = 0; i < bv.bits_.size(); ++i) {
    BitVector::BitContainer b = bv.bits_[i];
    uint32_t j = 0;
    while (b != 0) {
      if (b & 1) {
        out << ' ' << i * BitVector::kBitContainerSize + j;
      }
      ++j;
      b = b >> 1;
    }
  }
  out << "}";
  return out;
}